

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O2

void Llb_MtrUseSelectedColumn(Llb_Mtr_t *p,int iCol)

{
  char *pcVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  
  if ((iCol < 1) || (p->nCols + -1 <= iCol)) {
    __assert_fail("iCol >= 1 && iCol < p->nCols - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Sched.c"
                  ,0xa0,"void Llb_MtrUseSelectedColumn(Llb_Mtr_t *, int)");
  }
  lVar2 = 0;
  do {
    if (p->nRows <= lVar2) {
      return;
    }
    if (p->pMatrix[(uint)iCol][lVar2] != '\0') {
      pcVar1 = p->pProdVars;
      if (pcVar1[lVar2] == '\0') {
        pcVar1[lVar2] = '\x01';
        piVar3 = p->pProdNums;
        iVar4 = p->pRowSums[lVar2];
        piVar3[lVar2] = iVar4;
      }
      else if (pcVar1[lVar2] == '\x01') {
        piVar3 = p->pProdNums;
        iVar4 = piVar3[lVar2];
        if (iVar4 == 1) {
          pcVar1[lVar2] = '\0';
          p->pProdNums[lVar2] = 0;
          goto LAB_006613cc;
        }
      }
      else {
        piVar3 = p->pProdNums;
        iVar4 = piVar3[lVar2];
      }
      piVar3[lVar2] = iVar4 + -1;
      if (iVar4 < 1) {
        __assert_fail("p->pProdNums[iVar] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Sched.c"
                      ,0xb1,"void Llb_MtrUseSelectedColumn(Llb_Mtr_t *, int)");
      }
    }
LAB_006613cc:
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void Llb_MtrUseSelectedColumn( Llb_Mtr_t * p, int iCol )
{
    int iVar;
    assert( iCol >= 1 && iCol < p->nCols - 1 );
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pMatrix[iCol][iVar] == 0 )
            continue;
        if ( p->pProdVars[iVar] == 1 && p->pProdNums[iVar] == 1 )
        {
            p->pProdVars[iVar] = 0;
            p->pProdNums[iVar] = 0;
            continue;
        }
        if ( p->pProdVars[iVar] == 0 )
        {
            p->pProdVars[iVar] = 1;
            p->pProdNums[iVar] = p->pRowSums[iVar];
        }
        p->pProdNums[iVar]--;
        assert( p->pProdNums[iVar] >= 0 );
        if ( p->pProdNums[iVar] < 0 )
            Abc_Print( -1, "Llb_MtrUseSelectedColumn() Internal error!\n" );
    }
}